

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qgregoriancalendar.cpp
# Opt level: O3

qint64 __thiscall
QGregorianCalendar::matchCenturyToWeekday(QGregorianCalendar *this,YearMonthDay *parts,int dow)

{
  int month;
  int day;
  int iVar1;
  uint uVar2;
  uint uVar3;
  _Storage<long_long,_true> _Var4;
  int iVar5;
  uint uVar6;
  optional<long_long> oVar7;
  
  iVar5 = parts->year;
  month = parts->month;
  day = parts->day;
  oVar7 = julianFromParts(iVar5,month,day);
  _Var4._M_value =
       oVar7.super__Optional_base<long_long,_true,_true>._M_payload.
       super__Optional_payload_base<long_long>._M_payload;
  if (((undefined1  [16])
       oVar7.super__Optional_base<long_long,_true,_true>._M_payload.
       super__Optional_payload_base<long_long> & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
    if (_Var4._M_value < 0) {
      iVar1 = ((int)((ulong)~_Var4._M_value / 7) * 7 - (int)~_Var4._M_value) + 6;
    }
    else {
      iVar1 = (int)((ulong)_Var4._M_value / 7) * -7 +
              oVar7.super__Optional_base<long_long,_true,_true>._M_payload.
              super__Optional_payload_base<long_long>._M_payload._0_4_;
    }
    uVar2 = (iVar1 + 1) - dow;
    if (uVar2 == 0) {
      return _Var4._M_value;
    }
    iVar5 = iVar5 - (iVar5 >> 0x1f);
    uVar6 = iVar5 - (uint)(month < 3);
    if ((int)uVar6 < 0) {
      uVar6 = ~(~uVar6 / 100);
    }
    else {
      uVar6 = uVar6 / 100;
    }
    uVar6 = (uVar6 & 3) + uVar2 * 4;
    if ((int)uVar2 < 0) {
      if (~uVar6 % 7 < 3) {
        return -0x8000000000000000;
      }
      uVar2 = ((~uVar2 / 7) * 7 - ~uVar2) + 6;
    }
    else {
      if (3 < uVar6 % 7) {
        return -0x8000000000000000;
      }
      uVar2 = uVar2 % 7;
    }
    uVar3 = uVar2 + 3 >> 1;
    uVar6 = uVar3 - 4;
    if (uVar2 + 3 < 8) {
      uVar6 = uVar3;
    }
    iVar5 = iVar5 + uVar6 * 100 + -100;
    oVar7 = julianFromParts(iVar5 - (uint)(iVar5 < 1),month,day);
    _Var4._M_value =
         oVar7.super__Optional_base<long_long,_true,_true>._M_payload.
         super__Optional_payload_base<long_long>._M_payload;
    if (((undefined1  [16])
         oVar7.super__Optional_base<long_long,_true,_true>._M_payload.
         super__Optional_payload_base<long_long> & (undefined1  [16])0x1) != (undefined1  [16])0x0)
    {
      if (_Var4._M_value < 0) {
        iVar5 = ((int)((ulong)~_Var4._M_value / 7) * 7 - (int)~_Var4._M_value) + 6;
      }
      else {
        iVar5 = (int)((ulong)_Var4._M_value / 7) * -7 +
                oVar7.super__Optional_base<long_long,_true,_true>._M_payload.
                super__Optional_payload_base<long_long>._M_payload._0_4_;
      }
      if (iVar5 + 1 == dow) {
        return _Var4._M_value;
      }
    }
    return -0x8000000000000000;
  }
  if (day == 0x1d && month == 2) {
    uVar2 = iVar5 - (iVar5 >> 0x1f);
    if ((int)uVar2 < 0) {
      uVar6 = ~uVar2 / 100;
      uVar3 = ~uVar6;
      uVar6 = (uVar6 * 100 - ~uVar2) + 99;
    }
    else {
      uVar3 = uVar2 / 100;
      uVar6 = uVar2 % 100;
    }
    if (uVar6 == 0) {
      iVar5 = -100;
      if ((uVar3 & 3) != 1) {
        iVar5 = (4 - (uVar3 & 3)) * 100;
      }
      oVar7 = julianFromParts((iVar5 + uVar2) - (uint)((int)(iVar5 + uVar2) < 1),2,0x1d);
      _Var4._M_value =
           oVar7.super__Optional_base<long_long,_true,_true>._M_payload.
           super__Optional_payload_base<long_long>._M_payload;
      if (((undefined1  [16])
           oVar7.super__Optional_base<long_long,_true,_true>._M_payload.
           super__Optional_payload_base<long_long> & (undefined1  [16])0x1) != (undefined1  [16])0x0
         ) {
        if (_Var4._M_value < 0) {
          iVar5 = ((int)((ulong)~_Var4._M_value / 7) * 7 - (int)~_Var4._M_value) + 6;
        }
        else {
          iVar5 = (int)((ulong)_Var4._M_value / 7) * -7 +
                  oVar7.super__Optional_base<long_long,_true,_true>._M_payload.
                  super__Optional_payload_base<long_long>._M_payload._0_4_;
        }
        if (iVar5 + 1 == dow) {
          return _Var4._M_value;
        }
      }
    }
  }
  return -0x8000000000000000;
}

Assistant:

qint64
QGregorianCalendar::matchCenturyToWeekday(const QCalendar::YearMonthDay &parts, int dow) const
{
    /* The Gregorian four-century cycle is a whole number of weeks long, so we
       only need to consider four centuries, from previous through next-but-one.
       There are thus three days of the week that can't happen, for any given
       day-of-month, month and year-mod-100. (Exception: '00 Feb 29 has only one
       option.)
    */
    auto maybe = julianFromParts(parts.year, parts.month, parts.day);
    if (maybe) {
        int diff = weekDayOfJulian(*maybe) - dow;
        if (!diff)
            return *maybe;
        int year = parts.year < 0 ? parts.year + 1 : parts.year;
        // What matters is the placement of leap days, so dates before March
        // effectively belong with the dates since the preceding March:
        const auto yearSplit = qDivMod<100>(year - (parts.month < 3 ? 1 : 0));
        const int centuryMod4 = qMod<4>(yearSplit.quotient);
        // Week-day shift for a century is 5, unless crossing a multiple of 400's Feb 29th.
        static_assert(qMod<7>(36524) == 5); // and (3 * 5) % 7 = 1
        // Formulae arrived at by case-by-case analysis of the values of
        // centuryMod4 and diff (and the above clue to multiply by -3 = 4):
        if (qMod<7>(diff * 4 + centuryMod4) < 4) {
            // Century offset maps qMod<7>(diff) in {5, 6} to -1, {3, 4} to +2, and {1, 2} to +1:
            year += (((qMod<7>(diff) + 3) / 2) % 4 - 1) * 100;
            maybe = julianFromParts(year > 0 ? year : year - 1, parts.month, parts.day);
            if (maybe && weekDayOfJulian(*maybe) == dow)
                return *maybe;
            Q_ASSERT(parts.month == 2 && parts.day == 29
                     && dow != int(Qt::Tuesday) && !(year % 100));
        }

    } else if (parts.month == 2 && parts.day == 29) {
        int year = parts.year < 0 ? parts.year + 1 : parts.year;
        // Feb 29th on a century needs to resolve to a multiple of 400 years.
        const auto yearSplit = qDivMod<100>(year);
        if (!yearSplit.remainder) {
            const auto centuryMod4 = qMod<4>(yearSplit.quotient);
            Q_ASSERT(centuryMod4); // or we'd have got a valid date to begin with.
            if (centuryMod4 == 1) // round down
                year -= 100;
            else // 2 or 3; round up
                year += (4 - centuryMod4) * 100;
            maybe = julianFromParts(year > 0 ? year : year - 1, parts.month, parts.day);
            if (maybe && weekDayOfJulian(*maybe) == dow) // (Can only happen for Tuesday.)
                return *maybe;
            Q_ASSERT(dow != int(Qt::Tuesday));
        }
    }
    return (std::numeric_limits<qint64>::min)();
}